

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWritePla.c
# Opt level: O2

int Io_WriteMoPlaM(Abc_Ntk_t *pNtk,char *pFileName,int nMints)

{
  char *pcVar1;
  FILE *__stream;
  char *pcVar2;
  
  if ((pNtk->ntkType != ABC_NTK_STRASH) &&
     ((pNtk->ntkType != ABC_NTK_LOGIC || (pNtk->ntkFunc != ABC_FUNC_BDD)))) {
    __assert_fail("Abc_NtkIsStrash(pNtk) || Abc_NtkIsBddLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWritePla.c"
                  ,0x230,"int Io_WriteMoPlaM(Abc_Ntk_t *, char *, int)");
  }
  __stream = fopen(pFileName,"w");
  if (__stream == (FILE *)0x0) {
    fwrite("Io_WriteMoPlaM(): Cannot open the output file.\n",0x2f,1,_stdout);
  }
  else {
    pcVar1 = pNtk->pName;
    pcVar2 = Extra_TimeStamp();
    fprintf(__stream,"# Benchmark \"%s\" written by ABC on %s\n",pcVar1,pcVar2);
    Io_WriteMoPlaOneM((FILE *)__stream,pNtk,nMints);
    fclose(__stream);
  }
  return (uint)(__stream != (FILE *)0x0);
}

Assistant:

int Io_WriteMoPlaM( Abc_Ntk_t * pNtk, char * pFileName, int nMints )
{
    FILE * pFile;
    assert( Abc_NtkIsStrash(pNtk) || Abc_NtkIsBddLogic(pNtk) );
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteMoPlaM(): Cannot open the output file.\n" );
        return 0;
    }
    fprintf( pFile, "# Benchmark \"%s\" written by ABC on %s\n", pNtk->pName, Extra_TimeStamp() );
    Io_WriteMoPlaOneM( pFile, pNtk, nMints );
    fclose( pFile );
    return 1;
}